

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerScopedLdInst(Lowerer *this,Instr *instr,JnHelperMethod helperMethod)

{
  LowererMD *this_00;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  Opnd *pOVar4;
  undefined4 *puVar5;
  StackSym *sym;
  Instr *pIVar6;
  JITTimeFunctionBody *this_01;
  intptr_t address;
  AddrOpnd *opndArg;
  RegOpnd *dst;
  SymOpnd *src;
  
  LoadScriptContext(this,instr);
  pOVar4 = IR::Instr::UnlinkSrc2(instr);
  OVar2 = IR::Opnd::GetKind(pOVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1b18,"(src->IsRegOpnd())","Expected Reg opnd as src2");
    if (!bVar3) goto LAB_0059b585;
    *puVar5 = 0;
  }
  sym = IR::Opnd::GetStackSym(pOVar4);
  pIVar6 = InsertLoadStackAddress(this,sym,instr,(RegOpnd *)0x0);
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,instr,pIVar6->m_dst);
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  address = JITTimeFunctionBody::GetRootObject(this_01);
  opndArg = IR::AddrOpnd::New(address,AddrOpndKindDynamicVar,instr->m_func,true,(Var)0x0);
  LowererMD::LoadHelperArgument(this_00,instr,&opndArg->super_Opnd);
  pOVar4 = IR::Instr::UnlinkSrc1(instr);
  OVar2 = IR::Opnd::GetKind(pOVar4);
  if (OVar2 == OpndKindSym) {
    OVar2 = IR::Opnd::GetKind(pOVar4);
    if (OVar2 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar3) goto LAB_0059b585;
      *puVar5 = 0;
    }
    if (*(char *)((long)pOVar4[1]._vptr_Opnd + 0x14) == '\x02') goto LAB_0059b50f;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar5 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x1b29,"(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym())",
                     "Expected property sym as src");
  if (!bVar3) {
LAB_0059b585:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar5 = 0;
LAB_0059b50f:
  LoadPropertySymAsArgument(this,instr,pOVar4);
  pIVar6 = LowererMD::ChangeToHelperCall
                     (this_00,instr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,
                      (PropertySymOpnd *)0x0,false);
  dst = IR::RegOpnd::New(sym,TyVar,this->m_func);
  src = IR::SymOpnd::New(&sym->super_Sym,TyVar,this->m_func);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,pIVar6,true);
  return pIVar6;
}

Assistant:

IR::Instr *
Lowerer::LowerScopedLdInst(IR::Instr *instr, IR::JnHelperMethod helperMethod)
{
    IR::Opnd *src;
    IR::Instr *instrPrev;

    // last argument is the scriptContext
    instrPrev = LoadScriptContext(instr);
    src = instr->UnlinkSrc2();
    AssertMsg(src->IsRegOpnd(), "Expected Reg opnd as src2");

    // __out Var*. The StackSym is allocated in irbuilder, and here we need to insert a lea
    StackSym* dstSym = src->GetStackSym();
    IR::Instr *load = InsertLoadStackAddress(dstSym, instr);
    IR::Opnd* tempOpnd = load->GetDst();
    m_lowererMD.LoadHelperArgument(instr, tempOpnd);

    // now 3rd last argument is the rootObject of the function. Need to add addrOpnd to
    // pass in the address of the roobObject.
    IR::Opnd * srcOpnd;
    intptr_t rootObject = m_func->GetJITFunctionBody()->GetRootObject();
    srcOpnd = IR::AddrOpnd::New(rootObject, IR::AddrOpndKindDynamicVar, instr->m_func, true);
    instrPrev = m_lowererMD.LoadHelperArgument(instr, srcOpnd);

    // no change, the property field built from irbuilder.
    src = instr->UnlinkSrc1();
    AssertMsg(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as src");
    this->LoadPropertySymAsArgument(instr, src);

    instrPrev = m_lowererMD.ChangeToHelperCall(instr, helperMethod);

    IR::RegOpnd* regOpnd = IR::RegOpnd::New(dstSym, TyVar, m_func);
    IR::SymOpnd*symOpnd = IR::SymOpnd::New(dstSym, TyVar, m_func);
    this->InsertMove(regOpnd, symOpnd, instrPrev);

    return instrPrev;
}